

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_closure(JSContext *ctx,JSValue bfunc,JSVarRef **cur_var_refs,JSStackFrame *sf)

{
  JSValue proto_00;
  JSValue v;
  JSValue val;
  JSValue func_obj_00;
  JSValue this_obj;
  JSValue JVar1;
  int iVar2;
  int iVar3;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  int64_t in_R8;
  JSValue JVar4;
  JSValue JVar5;
  int proto_class_id;
  JSValue proto;
  JSAtom name_atom;
  JSValue func_obj;
  JSFunctionBytecode *b;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  JSValueUnion in_stack_ffffffffffffff60;
  void *in_stack_ffffffffffffff68;
  JSAutoInitIDEnum in_stack_ffffffffffffff70;
  JSAtom in_stack_ffffffffffffff74;
  JSContext *in_stack_ffffffffffffff78;
  JSVarRef **in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  JSAtom name;
  JSContext *in_stack_ffffffffffffff90;
  JSContext *ctx_00;
  JSAtom prop;
  undefined4 in_stack_ffffffffffffffa8;
  JSValueUnion JVar6;
  int flags;
  undefined4 local_10;
  undefined4 uStack_c;
  undefined8 local_8;
  
  JVar6 = in_RSI;
  JVar4 = JS_NewObjectClass((JSContext *)in_stack_ffffffffffffff60.ptr,in_stack_ffffffffffffff5c);
  flags = JVar6.int32;
  iVar2 = JS_IsException(JVar4);
  if (iVar2 != 0) {
    JVar4.tag._0_4_ = in_stack_ffffffffffffff70;
    JVar4.u.ptr = in_stack_ffffffffffffff68;
    JVar4.tag._4_4_ = in_stack_ffffffffffffff74;
    JS_FreeValue((JSContext *)in_stack_ffffffffffffff60.ptr,JVar4);
    local_10 = 0;
    local_8 = (JSContext *)0x6;
    goto LAB_0015afdd;
  }
  JVar5 = js_closure2(in_stack_ffffffffffffff90,JVar4,
                      (JSFunctionBytecode *)
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      in_stack_ffffffffffffff80,(JSStackFrame *)in_stack_ffffffffffffff78);
  iVar3 = JVar5.u._0_4_;
  name = JVar5.u._4_4_;
  ctx_00 = (JSContext *)JVar5.tag;
  JVar6 = JVar5.u;
  local_8 = ctx_00;
  iVar2 = JS_IsException(JVar5);
  if (iVar2 == 0) {
    iVar2 = *(int *)((long)in_RSI.ptr + 0x2c);
    if (iVar2 == 0) {
      iVar2 = 0x2f;
    }
    js_function_set_properties(ctx_00,JVar4,name,iVar3);
    prop = JVar4.tag._4_4_;
    if ((*(ushort *)((long)in_RSI.ptr + 0x19) >> 4 & 1) == 0) {
      if ((*(ushort *)((long)in_RSI.ptr + 0x19) & 1) != 0) {
        func_obj_00.tag = (int64_t)local_8;
        func_obj_00.u.float64 = JVar6.float64;
        JS_SetConstructorBit(in_RDI,func_obj_00,1);
        JVar5.tag._0_4_ = iVar3;
        JVar5.u.ptr = in_stack_ffffffffffffff80;
        JVar5.tag._4_4_ = name;
        JS_DefineAutoInitProperty
                  (in_stack_ffffffffffffff78,JVar5,in_stack_ffffffffffffff74,
                   in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,flags);
      }
    }
    else {
      if (((byte)(*(ushort *)((long)in_RSI.ptr + 0x19) >> 4) & 3) == 3) {
        in_stack_ffffffffffffff74 = 0x32;
      }
      else {
        in_stack_ffffffffffffff74 = 0x28;
      }
      proto_00.u._4_4_ = in_stack_ffffffffffffff5c;
      proto_00.u.int32 = in_stack_ffffffffffffff58;
      proto_00.tag = (int64_t)in_stack_ffffffffffffff60.ptr;
      JVar4 = JS_NewObjectProto((JSContext *)0x15aed3,proto_00);
      in_stack_ffffffffffffff60 = JVar4.u;
      in_stack_ffffffffffffff68 = (void *)JVar4.tag;
      iVar3 = JS_IsException(JVar4);
      if (iVar3 != 0) goto LAB_0015afaf;
      this_obj.tag = in_R8;
      this_obj.u.ptr = in_RSI.ptr;
      val.tag = (int64_t)local_8;
      val.u.float64 = JVar6.float64;
      JS_DefinePropertyValue
                ((JSContext *)CONCAT44(iVar2,in_stack_ffffffffffffffa8),this_obj,prop,val,flags);
    }
    local_10 = JVar6.int32;
    uStack_c = JVar6._4_4_;
  }
  else {
LAB_0015afaf:
    v.tag._0_4_ = in_stack_ffffffffffffff70;
    v.u.ptr = in_stack_ffffffffffffff68;
    v.tag._4_4_ = in_stack_ffffffffffffff74;
    JS_FreeValue((JSContext *)in_stack_ffffffffffffff60.ptr,v);
    local_10 = 0;
    local_8 = (JSContext *)0x6;
  }
LAB_0015afdd:
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = (int64_t)local_8;
  return JVar1;
}

Assistant:

static JSValue js_closure(JSContext *ctx, JSValue bfunc,
                          JSVarRef **cur_var_refs,
                          JSStackFrame *sf)
{
    JSFunctionBytecode *b;
    JSValue func_obj;
    JSAtom name_atom;

    b = JS_VALUE_GET_PTR(bfunc);
    func_obj = JS_NewObjectClass(ctx, func_kind_to_class_id[b->func_kind]);
    if (JS_IsException(func_obj)) {
        JS_FreeValue(ctx, bfunc);
        return JS_EXCEPTION;
    }
    func_obj = js_closure2(ctx, func_obj, b, cur_var_refs, sf);
    if (JS_IsException(func_obj)) {
        /* bfunc has been freed */
        goto fail;
    }
    name_atom = b->func_name;
    if (name_atom == JS_ATOM_NULL)
        name_atom = JS_ATOM_empty_string;
    js_function_set_properties(ctx, func_obj, name_atom,
                               b->defined_arg_count);

    if (b->func_kind & JS_FUNC_GENERATOR) {
        JSValue proto;
        int proto_class_id;
        /* generators have a prototype field which is used as
           prototype for the generator object */
        if (b->func_kind == JS_FUNC_ASYNC_GENERATOR)
            proto_class_id = JS_CLASS_ASYNC_GENERATOR;
        else
            proto_class_id = JS_CLASS_GENERATOR;
        proto = JS_NewObjectProto(ctx, ctx->class_proto[proto_class_id]);
        if (JS_IsException(proto))
            goto fail;
        JS_DefinePropertyValue(ctx, func_obj, JS_ATOM_prototype, proto,
                               JS_PROP_WRITABLE);
    } else if (b->has_prototype) {
        /* add the 'prototype' property: delay instantiation to avoid
           creating cycles for every javascript function. The prototype
           object is created on the fly when first accessed */
        JS_SetConstructorBit(ctx, func_obj, TRUE);
        JS_DefineAutoInitProperty(ctx, func_obj, JS_ATOM_prototype,
                                  JS_AUTOINIT_ID_PROTOTYPE, NULL,
                                  JS_PROP_WRITABLE);
    }
    return func_obj;
 fail:
    /* bfunc is freed when func_obj is freed */
    JS_FreeValue(ctx, func_obj);
    return JS_EXCEPTION;
}